

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O3

SegmentReader * __thiscall capnp::_::BuilderArena::tryGetSegment(BuilderArena *this,SegmentId id)

{
  MultiSegmentState *pMVar1;
  Own<capnp::_::SegmentBuilder,_std::nullptr_t> *pOVar2;
  SegmentReader *pSVar3;
  
  if (id.value == 0) {
    pSVar3 = &(this->segment0).super_SegmentReader;
    if ((this->segment0).super_SegmentReader.arena == (Arena *)0x0) {
      pSVar3 = (SegmentReader *)0x0;
    }
    return pSVar3;
  }
  pMVar1 = (this->moreSegments).ptr.ptr;
  if ((pMVar1 != (MultiSegmentState *)0x0) &&
     (pOVar2 = (pMVar1->builders).builder.ptr,
     (ulong)id.value <= (ulong)((long)(pMVar1->builders).builder.pos - (long)pOVar2 >> 4))) {
    return &(pOVar2[id.value - 1].ptr)->super_SegmentReader;
  }
  return (SegmentReader *)0x0;
}

Assistant:

SegmentReader* BuilderArena::tryGetSegment(SegmentId id) {
  if (id == SegmentId(0)) {
    if (segment0.getArena() == nullptr) {
      // We haven't allocated any segments yet.
      return nullptr;
    } else {
      return &segment0;
    }
  } else {
    KJ_IF_SOME(segmentState, moreSegments) {
      if (id.value <= segmentState.get()->builders.size()) {
        // TODO(cleanup):  Return a const SegmentReader and tediously constify all SegmentBuilder
        //   pointers throughout the codebase.
        return const_cast<SegmentReader*>(kj::implicitCast<const SegmentReader*>(
            segmentState.get()->builders[id.value - 1].get()));
      }
    }
    return nullptr;
  }
}